

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O0

int testSpanTestsIteratorImmutable(void)

{
  initializer_list<int> __l;
  iterator ptVar1;
  ostream *poVar2;
  Span<const_int,_18446744073709551615UL> SVar3;
  int *i;
  iterator __end1;
  iterator __begin1;
  Span<const_int,_18446744073709551615UL> *__range1;
  undefined1 auStack_70 [4];
  int counter;
  Span<const_int,_18446744073709551615UL> span;
  allocator<int> local_49;
  int local_48 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> values;
  
  local_48[0] = 1;
  local_48[1] = 2;
  local_48[2] = 3;
  local_48[3] = 4;
  local_38 = local_48;
  local_30 = 4;
  std::allocator<int>::allocator(&local_49);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_49);
  std::allocator<int>::~allocator(&local_49);
  SVar3 = MILBlob::Util::MakeSpan<int,_std::vector,_std::allocator<int>_>
                    ((vector<int,_std::allocator<int>_> *)local_28);
  span.m_ptr = (pointer)SVar3.m_size.m_size;
  _auStack_70 = SVar3.m_ptr;
  __range1._4_4_ = 0;
  __end1 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::begin
                     ((Span<const_int,_18446744073709551615UL> *)auStack_70);
  ptVar1 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::end
                     ((Span<const_int,_18446744073709551615UL> *)auStack_70);
  do {
    if (__end1 == ptVar1) {
      if (__range1._4_4_ == 4) {
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 0;
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x126);
        poVar2 = std::operator<<(poVar2,": error: ");
        poVar2 = std::operator<<(poVar2,"(counter) == (4)");
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 1;
      }
LAB_001c107c:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28)
      ;
      return values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_;
    }
    __range1._4_4_ = __range1._4_4_ + 1;
    if (*__end1 != __range1._4_4_) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x124);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"(i) == (++counter)");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
      goto LAB_001c107c;
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

int testSpanTestsIteratorImmutable()
{
    const std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    int counter = 0;
    for (auto& i : span) {
        static_assert(std::is_same<decltype(i), const int&>::value, "iterator must be const");
        ML_ASSERT_EQ(i, ++counter);
    }
    ML_ASSERT_EQ(counter, 4);

    return 0;
}